

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O3

void __thiscall
chrono::robosimian::RS_Limb::Initialize
          (RS_Limb *this,shared_ptr<chrono::ChBodyAuxRef> *chassis,ChVector<double> *xyz,
          ChVector<double> *rpy,Enum collision_family,ActuationMode wheel_mode)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  double dVar1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  RS_Part *this_00;
  pointer pcVar5;
  element_type *peVar6;
  int iVar7;
  iterator iVar8;
  long lVar9;
  undefined1 *puVar10;
  ChLinkLockLock *this_01;
  long *plVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_t size;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  shared_ptr<chrono::ChLinkLockLock> joint;
  shared_ptr<chrono::ChLinkLockLock> local_5a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_598;
  ChQuaternion<double> local_590;
  RS_Limb *local_570;
  ChFrame *local_568;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_560;
  element_type *local_558;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_550 [2];
  shared_ptr<chrono::ChBodyAuxRef> *local_540;
  Enum local_534;
  undefined1 local_530 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_520;
  element_type *peStack_510;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_508;
  double dStack_500;
  double local_4f8;
  ChMatrix33<double> local_4f0;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_4a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4a0;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_498;
  _func_int **local_490;
  _func_int **local_488;
  ActuationMode local_47c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_478;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_470;
  shared_ptr<chrono::ChFunction> local_468;
  ChFrame *local_458;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_450;
  element_type *local_448;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_440;
  ChFrame *local_438;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_430;
  element_type *local_428;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_420;
  shared_ptr<chrono::ChFunction> local_418;
  ChFrame *local_408;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_400;
  element_type *local_3f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3f0;
  ChLinkLockLock *local_3e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3e0;
  ChLinkLockLock *local_3d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3d0;
  ChLinkLockLock *local_3c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3c0;
  ChLinkLockLock *local_3b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3b0;
  ChFrame *local_3a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3a0;
  element_type *local_398;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_390;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_380;
  undefined **local_378;
  shared_ptr<chrono::ChFunction> local_370;
  undefined1 local_360 [32];
  double dStack_340;
  double local_338;
  double dStack_330;
  double local_328;
  double local_320;
  double dStack_318;
  double dStack_310;
  double dStack_308;
  double dStack_300;
  double dStack_2f8;
  double dStack_2f0;
  double dStack_2e8;
  double local_2e0;
  ChFrame<double> local_2d8;
  undefined1 local_250 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  double dStack_220;
  double local_218;
  ChMatrix33<double> local_210;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  local_558 = (chassis->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  a_Stack_550[0]._M_pi =
       (chassis->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  p_Var3 = (chassis->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_570 = this;
  local_540 = chassis;
  local_534 = collision_family;
  local_47c = wheel_mode;
  local_360._0_8_ = local_360 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"link0","");
  local_470 = &(local_570->m_links)._M_h;
  iVar8 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(local_470,(key_type *)local_360);
  lVar9 = *(long *)((long)iVar8.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                          ._M_cur + 0x28);
  local_568 = *(ChFrame **)(lVar9 + 0x28);
  _Stack_560._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x30);
  lVar9 = *(long *)(lVar9 + 0x30);
  if (lVar9 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar9 + 8) = *(int *)(lVar9 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar9 + 8) = *(int *)(lVar9 + 8) + 1;
    }
  }
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  lVar9 = (**(code **)(*(long *)local_558 + 0x1f0))();
  local_360._0_8_ = &PTR__ChFrame_0017db90;
  local_360._8_8_ = *(double *)(lVar9 + 8);
  local_360._16_8_ = *(size_type *)(lVar9 + 0x10);
  local_360._24_8_ = *(undefined8 *)(lVar9 + 0x18);
  dStack_340 = *(double *)(lVar9 + 0x20);
  local_338 = *(double *)(lVar9 + 0x28);
  dStack_330 = *(double *)(lVar9 + 0x30);
  local_328 = *(double *)(lVar9 + 0x38);
  local_320 = *(double *)(lVar9 + 0x40);
  dStack_318 = *(double *)(lVar9 + 0x48);
  dStack_310 = *(double *)(lVar9 + 0x50);
  dStack_308 = *(double *)(lVar9 + 0x58);
  dStack_300 = *(double *)(lVar9 + 0x60);
  dStack_2f8 = *(double *)(lVar9 + 0x68);
  dStack_2f0 = *(double *)(lVar9 + 0x70);
  dStack_2e8 = *(double *)(lVar9 + 0x78);
  local_2e0 = *(double *)(lVar9 + 0x80);
  rpy2quat((ChQuaternion<double> *)&local_2d8,rpy);
  local_250._0_8_ = &PTR__ChFrame_0017db90;
  dVar1 = xyz->m_data[2];
  auVar13._8_8_ = dVar1;
  auVar13._0_8_ = dVar1;
  auVar13._16_8_ = dVar1;
  auVar13._24_8_ = dVar1;
  auVar13 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])xyz->m_data),auVar13,0x30);
  auVar15._8_8_ = local_2d8._vptr_ChFrame;
  auVar15._0_8_ = local_2d8._vptr_ChFrame;
  auVar15._16_8_ = local_2d8._vptr_ChFrame;
  auVar15._24_8_ = local_2d8._vptr_ChFrame;
  local_250._8_32_ = vblendps_avx(auVar13,auVar15,0xc0);
  local_228 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8.coord.pos.m_data[0];
  dStack_220 = local_2d8.coord.pos.m_data[1];
  local_218 = local_2d8.coord.pos.m_data[2];
  ChMatrix33<double>::ChMatrix33(&local_210,(ChQuaternion<double> *)&local_2d8);
  ChFrame<double>::operator*(&local_2d8,(ChFrame<double> *)local_360,(ChFrame<double> *)local_250);
  local_378 = &PTR__ChFrame_0017db90;
  chrono::ChBodyAuxRef::SetFrame_REF_to_abs(local_568);
  lVar9 = 0;
  local_4a8 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&local_570->m_joints;
  local_498 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&local_570->m_motors;
  local_380 = &(local_540->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount;
  local_478 = &(local_570->m_wheel_motor).
               super___shared_ptr<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
  local_488 = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017e7e0;
  local_490 = (_func_int **)chrono::ChLinkMarkers::Initialize;
  do {
    iVar8 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(local_470,(key_type *)(&DAT_001829a0 + lVar9));
    lVar4 = *(long *)((long)iVar8.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                            ._M_cur + 0x28);
    local_4a0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)iVar8.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                        ._M_cur + 0x30);
    if (local_4a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_4a0->_M_use_count = local_4a0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_4a0->_M_use_count = local_4a0->_M_use_count + 1;
      }
    }
    iVar8 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(local_470,(key_type *)(&DAT_001829c0 + lVar9));
    this_00 = *(RS_Part **)
               ((long)iVar8.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                      ._M_cur + 0x28);
    local_598 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)iVar8.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>,_true>
                        ._M_cur + 0x30);
    if (local_598 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_598->_M_use_count = local_598->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_598->_M_use_count = local_598->_M_use_count + 1;
      }
    }
    local_558 = *(element_type **)(lVar4 + 0x28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (a_Stack_550,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar4 + 0x30));
    local_568 = (ChFrame *)
                (this_00->m_body).
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_560,
               &(this_00->m_body).
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    puVar10 = (undefined1 *)(**(code **)(*(long *)local_558 + 0x1f0))();
    if (puVar10 != local_360) {
      local_360._8_8_ = *(undefined8 *)(puVar10 + 8);
      local_360._16_8_ = *(undefined8 *)(puVar10 + 0x10);
      local_360._24_8_ = *(undefined8 *)(puVar10 + 0x18);
      dStack_340 = *(double *)(puVar10 + 0x20);
      local_338 = *(double *)(puVar10 + 0x28);
      dStack_330 = *(double *)(puVar10 + 0x30);
      local_328 = *(double *)(puVar10 + 0x38);
      local_320 = *(double *)(puVar10 + 0x40);
      dStack_318 = *(double *)(puVar10 + 0x48);
      dStack_310 = *(double *)(puVar10 + 0x50);
      dStack_308 = *(double *)(puVar10 + 0x58);
      dStack_300 = *(double *)(puVar10 + 0x60);
      dStack_2f8 = *(double *)(puVar10 + 0x68);
      dStack_2f0 = *(double *)(puVar10 + 0x70);
      dStack_2e8 = *(double *)(puVar10 + 0x78);
      local_2e0 = *(double *)(puVar10 + 0x80);
    }
    rpy2quat(&local_590,(ChVector<double> *)(&DAT_00182a00 + lVar9));
    uVar2 = *(undefined8 *)(&DAT_001829f8 + lVar9);
    auVar14._8_8_ = uVar2;
    auVar14._0_8_ = uVar2;
    auVar14._16_8_ = uVar2;
    auVar14._24_8_ = uVar2;
    local_530._0_8_ = local_378;
    auVar13 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])(&DAT_001829e8 + lVar9)),auVar14,0x30);
    auVar16._8_8_ = local_590.m_data[0];
    auVar16._0_8_ = local_590.m_data[0];
    auVar16._16_8_ = local_590.m_data[0];
    auVar16._24_8_ = local_590.m_data[0];
    unique0x000ebc80 = vblendps_avx(auVar13,auVar16,0xc0);
    local_508._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_590.m_data[1];
    dStack_500 = local_590.m_data[2];
    local_4f8 = local_590.m_data[3];
    ChMatrix33<double>::ChMatrix33(&local_4f0,&local_590);
    local_250._8_32_ = stack0xfffffffffffffad8;
    local_228 = local_508._M_pi;
    dStack_220 = dStack_500;
    local_218 = local_4f8;
    local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    ChFrame<double>::operator*
              ((ChFrame<double> *)local_530,(ChFrame<double> *)local_360,
               (ChFrame<double> *)local_250);
    local_2d8.coord.pos.m_data[0] = (double)local_530._8_8_;
    local_2d8.coord.pos.m_data[1] = (double)aStack_520._M_allocated_capacity;
    local_2d8.coord.pos.m_data[2] = (double)aStack_520._8_8_;
    local_2d8.coord.rot.m_data[0] = (double)peStack_510;
    local_2d8.coord.rot.m_data[1] = (double)local_508._M_pi;
    local_2d8.coord.rot.m_data[2] = dStack_500;
    local_2d8.coord.rot.m_data[3] = local_4f8;
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    local_2d8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_4f0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    chrono::ChBodyAuxRef::SetFrame_REF_to_abs(local_568);
    if (lVar9 == 0) {
      local_558 = (local_540->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(a_Stack_550,local_380);
    }
    RS_Part::AddCollisionShapes(this_00);
    plVar11 = *(long **)(local_568 + 0x198);
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_568 + 0x1a0);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    (**(code **)(*plVar11 + 200))(plVar11,local_534);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    plVar11 = *(long **)(local_568 + 0x198);
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_568 + 0x1a0);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    (**(code **)(*plVar11 + 0xd8))(plVar11,local_534);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    size = (size_t)((&local_570->m_collide_links)
                    [this_00 ==
                     (local_570->m_wheel).
                     super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr] & 1);
    chrono::ChBody::SetCollide(SUB81(local_568,0));
    __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)&joints + lVar9);
    if ((&DAT_001829e0)[lVar9] == '\x01') {
      this_01 = (ChLinkLockLock *)ChLinkLock::operator_new((ChLinkLock *)0x1060,size);
      chrono::ChLinkLockLock::ChLinkLockLock(this_01);
      local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChLinkLockLock*>
                (&local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_01);
      peVar6 = local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_590.m_data[0] = (double)(local_590.m_data + 2);
      pcVar5 = (local_570->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_590,pcVar5,pcVar5 + (local_570->m_name)._M_string_length);
      std::__cxx11::string::append((char *)&local_590);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_590,*(ulong *)((long)&joints + lVar9));
      auVar13 = stack0xfffffffffffffad8;
      local_530._0_8_ = &aStack_520;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar12) {
        aStack_520._M_allocated_capacity = paVar12->_M_allocated_capacity;
        peStack_510 = auVar13._24_8_;
        aStack_520._8_8_ = plVar11[3];
      }
      else {
        aStack_520._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_530._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar11;
      }
      local_530._8_8_ = plVar11[1];
      *plVar11 = (long)paVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)(peVar6 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._0_8_ != &aStack_520) {
        operator_delete((void *)local_530._0_8_,aStack_520._M_allocated_capacity + 1);
      }
      if ((double *)local_590.m_data[0] != local_590.m_data + 2) {
        operator_delete((void *)local_590.m_data[0],(long)local_590.m_data[2] + 1);
      }
      peVar6 = local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_398 = local_558;
      p_Stack_390 = a_Stack_550[0]._M_pi;
      if (a_Stack_550[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (a_Stack_550[0]._M_pi)->_M_use_count = (a_Stack_550[0]._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (a_Stack_550[0]._M_pi)->_M_use_count = (a_Stack_550[0]._M_pi)->_M_use_count + 1;
        }
      }
      local_3a8 = local_568;
      p_Stack_3a0 = _Stack_560._M_pi;
      if (_Stack_560._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_560._M_pi)->_M_use_count = (_Stack_560._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_560._M_pi)->_M_use_count = (_Stack_560._M_pi)->_M_use_count + 1;
        }
      }
      calcJointFrame((ChCoordsys<double> *)local_530,&local_2d8,
                     (ChVector<double> *)(&DAT_00182a18 + lVar9));
      (**(code **)(*(long *)peVar6 + 0x250))
                (peVar6,&local_398,&local_3a8,
                 (allocator<chrono::ChLinkMotorRotationAngle> *)local_530);
      if (p_Stack_3a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_3a0);
      }
      if (p_Stack_390 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_390);
      }
      plVar11 = *(long **)((local_540->
                           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + 0x38);
      local_3b8 = local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      p_Stack_3b0 = local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      if (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      (**(code **)(*plVar11 + 0x138))(plVar11,&local_3b8);
      if (p_Stack_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_3b0);
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkLockLock>_>
      ::pair<std::shared_ptr<chrono::ChLinkLockLock>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkLockLock>_>
                  *)local_530,__x,&local_5a8);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkLockLock>>>
                (local_4a8,(allocator<chrono::ChLinkMotorRotationAngle> *)local_530);
      if (local_508._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_508._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._0_8_ != &aStack_520) {
        operator_delete((void *)local_530._0_8_,aStack_520._M_allocated_capacity + 1);
      }
      this_02._M_pi =
           local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_001424ff;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)__x);
      if (iVar7 == 0) {
        if (local_47c == SPEED) {
          this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
          local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (this_02._M_pi)->_M_use_count = 1;
          (this_02._M_pi)->_M_weak_count = 1;
          (this_02._M_pi)->_vptr__Sp_counted_base = local_488;
          this_02._M_pi[1]._vptr__Sp_counted_base = local_490;
          this_02._M_pi[1]._M_use_count = 0;
          this_02._M_pi[1]._M_weak_count = 0;
          this_02._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_02._M_pi[2]._M_use_count = 0;
          this_02._M_pi[2]._M_weak_count = 0;
          this_02._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_02._M_pi[2]._M_use_count = 0;
          this_02._M_pi[2]._M_weak_count = 0;
          this_02._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_02._M_pi[3]._M_use_count = 0;
          this_02._M_pi[3]._M_weak_count = 0;
          this_02._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::ChLinkMotorRotationSpeed,std::allocator<chrono::ChLinkMotorRotationSpeed>>
                    (&local_5a8.
                      super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(ChLinkMotorRotationSpeed **)&local_5a8,
                     (_Sp_alloc_shared_tag<std::allocator<chrono::ChLinkMotorRotationSpeed>_>)
                     local_530);
          peVar6 = local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_590.m_data[0] = (double)(local_590.m_data + 2);
          pcVar5 = (local_570->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_590,pcVar5,pcVar5 + (local_570->m_name)._M_string_length);
          std::__cxx11::string::append((char *)&local_590);
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_590,*(ulong *)((long)&joints + lVar9));
          auVar13 = stack0xfffffffffffffad8;
          local_530._0_8_ = &aStack_520;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar12) {
            aStack_520._M_allocated_capacity = paVar12->_M_allocated_capacity;
            peStack_510 = auVar13._24_8_;
            aStack_520._8_8_ = plVar11[3];
          }
          else {
            aStack_520._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_530._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar11;
          }
          local_530._8_8_ = plVar11[1];
          *plVar11 = (long)paVar12;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_assign((string *)(peVar6 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._0_8_ != &aStack_520) {
            operator_delete((void *)local_530._0_8_,aStack_520._M_allocated_capacity + 1);
          }
          if ((double *)local_590.m_data[0] != local_590.m_data + 2) {
            operator_delete((void *)local_590.m_data[0],(long)local_590.m_data[2] + 1);
          }
          peVar6 = local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_428 = local_558 + 0x78;
          if (local_558 == (element_type *)0x0) {
            local_428 = (element_type *)0x0;
          }
          local_420 = a_Stack_550[0]._M_pi;
          if (a_Stack_550[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (a_Stack_550[0]._M_pi)->_M_use_count = (a_Stack_550[0]._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (a_Stack_550[0]._M_pi)->_M_use_count = (a_Stack_550[0]._M_pi)->_M_use_count + 1;
            }
          }
          local_438 = local_568 + 0x78;
          if (local_568 == (ChFrame *)0x0) {
            local_438 = (ChFrame *)0x0;
          }
          local_430 = _Stack_560._M_pi;
          if (_Stack_560._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_560._M_pi)->_M_use_count = (_Stack_560._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_560._M_pi)->_M_use_count = (_Stack_560._M_pi)->_M_use_count + 1;
            }
          }
          calcJointFrame((ChCoordsys<double> *)local_530,&local_2d8,
                         (ChVector<double> *)(&DAT_00182a18 + lVar9));
          ChFrame<double>::ChFrame(&local_140,(ChCoordsys<double> *)local_530);
          (**(code **)(*(long *)peVar6 + 0x240))(peVar6,&local_428,&local_438,&local_140);
          if (local_430 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_430);
          }
          if (local_420 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_420);
          }
          local_370.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(this_02._M_pi + 1);
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
          }
          local_370.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = this_02._M_pi;
          ChLinkMotorRotationSpeed::SetSpeedFunction
                    ((ChLinkMotorRotationSpeed *)
                     local_5a8.
                     super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &local_370);
          if (local_370.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_370.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          plVar11 = *(long **)((local_540->
                               super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr + 0x38);
          local_3d8 = local_5a8.
                      super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Stack_3d0 = local_5a8.
                        super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          if (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          (**(code **)(*plVar11 + 0x138))(plVar11,&local_3d8);
          if (p_Stack_3d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_3d0);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
          ::pair<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
                      *)local_530,__x,(shared_ptr<chrono::ChLinkMotorRotationSpeed> *)&local_5a8);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
                    (local_4a8,(ChCoordsys<double> *)local_530);
          if (local_508._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_508._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._0_8_ != &aStack_520) {
            operator_delete((void *)local_530._0_8_,aStack_520._M_allocated_capacity + 1);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
          ::pair<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>
                      *)local_530,__x,(shared_ptr<chrono::ChLinkMotorRotationSpeed> *)&local_5a8);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
                    (local_498,(ChCoordsys<double> *)local_530);
          if (local_508._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_508._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._0_8_ != &aStack_520) {
            operator_delete((void *)local_530._0_8_,aStack_520._M_allocated_capacity + 1);
          }
          (local_570->m_wheel_motor).
          super___shared_ptr<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (local_478,
                     &local_5a8.
                      super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_5a8.
                       super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          goto LAB_001424ff;
        }
        this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
        local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (this_02._M_pi)->_M_use_count = 1;
        (this_02._M_pi)->_M_weak_count = 1;
        (this_02._M_pi)->_vptr__Sp_counted_base = local_488;
        this_02._M_pi[1]._vptr__Sp_counted_base = local_490;
        this_02._M_pi[1]._M_use_count = 0;
        this_02._M_pi[1]._M_weak_count = 0;
        this_02._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_02._M_pi[2]._M_use_count = 0;
        this_02._M_pi[2]._M_weak_count = 0;
        this_02._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_02._M_pi[2]._M_use_count = 0;
        this_02._M_pi[2]._M_weak_count = 0;
        this_02._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_02._M_pi[3]._M_use_count = 0;
        this_02._M_pi[3]._M_weak_count = 0;
        this_02._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::ChLinkMotorRotationAngle,std::allocator<chrono::ChLinkMotorRotationAngle>>
                  (&local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(ChLinkMotorRotationAngle **)&local_5a8,
                   (allocator<chrono::ChLinkMotorRotationAngle> *)local_530);
        peVar6 = local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_590.m_data[0] = (double)(local_590.m_data + 2);
        pcVar5 = (local_570->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_590,pcVar5,pcVar5 + (local_570->m_name)._M_string_length);
        std::__cxx11::string::append((char *)&local_590);
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_590,*(ulong *)((long)&joints + lVar9));
        auVar13 = stack0xfffffffffffffad8;
        local_530._0_8_ = &aStack_520;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar12) {
          aStack_520._M_allocated_capacity = paVar12->_M_allocated_capacity;
          peStack_510 = auVar13._24_8_;
          aStack_520._8_8_ = plVar11[3];
        }
        else {
          aStack_520._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_530._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar11;
        }
        local_530._8_8_ = plVar11[1];
        *plVar11 = (long)paVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::_M_assign((string *)(peVar6 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._0_8_ != &aStack_520) {
          operator_delete((void *)local_530._0_8_,aStack_520._M_allocated_capacity + 1);
        }
        if ((double *)local_590.m_data[0] != local_590.m_data + 2) {
          operator_delete((void *)local_590.m_data[0],(long)local_590.m_data[2] + 1);
        }
        peVar6 = local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_448 = local_558 + 0x78;
        if (local_558 == (element_type *)0x0) {
          local_448 = (element_type *)0x0;
        }
        local_440 = a_Stack_550[0]._M_pi;
        if (a_Stack_550[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (a_Stack_550[0]._M_pi)->_M_use_count = (a_Stack_550[0]._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (a_Stack_550[0]._M_pi)->_M_use_count = (a_Stack_550[0]._M_pi)->_M_use_count + 1;
          }
        }
        local_458 = local_568 + 0x78;
        if (local_568 == (ChFrame *)0x0) {
          local_458 = (ChFrame *)0x0;
        }
        local_450 = _Stack_560._M_pi;
        if (_Stack_560._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (_Stack_560._M_pi)->_M_use_count = (_Stack_560._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (_Stack_560._M_pi)->_M_use_count = (_Stack_560._M_pi)->_M_use_count + 1;
          }
        }
        calcJointFrame((ChCoordsys<double> *)local_530,&local_2d8,
                       (ChVector<double> *)(&DAT_00182a18 + lVar9));
        ChFrame<double>::ChFrame(&local_1c8,(ChCoordsys<double> *)local_530);
        (**(code **)(*(long *)peVar6 + 0x240))(peVar6,&local_448,&local_458,&local_1c8);
        if (local_450 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450);
        }
        if (local_440 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440);
        }
        local_468.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(this_02._M_pi + 1);
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
        }
        local_468.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = this_02._M_pi;
        ChLinkMotorRotationAngle::SetAngleFunction
                  ((ChLinkMotorRotationAngle *)
                   local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&local_468);
        if (local_468.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_468.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        plVar11 = *(long **)((local_540->
                             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + 0x38);
        local_3e8 = local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        p_Stack_3e0 = local_5a8.
                      super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        if (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        (**(code **)(*plVar11 + 0x138))(plVar11,&local_3e8);
        if (p_Stack_3e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_3e0);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::pair<std::shared_ptr<chrono::ChLinkMotorRotationAngle>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_530,__x,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)&local_5a8);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                  (local_4a8,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_530);
        if (local_508._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_508._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._0_8_ != &aStack_520) {
          operator_delete((void *)local_530._0_8_,aStack_520._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::pair<std::shared_ptr<chrono::ChLinkMotorRotationAngle>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_530,__x,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)&local_5a8);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                  (local_498,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_530);
        if (local_508._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_508._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._0_8_ != &aStack_520) {
          operator_delete((void *)local_530._0_8_,aStack_520._M_allocated_capacity + 1);
        }
        (local_570->m_wheel_motor).
        super___shared_ptr<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (local_478,
                   &local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      else {
        this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
        local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (this_02._M_pi)->_M_use_count = 1;
        (this_02._M_pi)->_M_weak_count = 1;
        (this_02._M_pi)->_vptr__Sp_counted_base = local_488;
        this_02._M_pi[1]._vptr__Sp_counted_base = local_490;
        this_02._M_pi[1]._M_use_count = 0;
        this_02._M_pi[1]._M_weak_count = 0;
        this_02._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_02._M_pi[2]._M_use_count = 0;
        this_02._M_pi[2]._M_weak_count = 0;
        this_02._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_02._M_pi[2]._M_use_count = 0;
        this_02._M_pi[2]._M_weak_count = 0;
        this_02._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_02._M_pi[3]._M_use_count = 0;
        this_02._M_pi[3]._M_weak_count = 0;
        this_02._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::ChLinkMotorRotationAngle,std::allocator<chrono::ChLinkMotorRotationAngle>>
                  (&local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(ChLinkMotorRotationAngle **)&local_5a8,
                   (allocator<chrono::ChLinkMotorRotationAngle> *)local_530);
        peVar6 = local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_590.m_data[0] = (double)(local_590.m_data + 2);
        pcVar5 = (local_570->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_590,pcVar5,pcVar5 + (local_570->m_name)._M_string_length);
        std::__cxx11::string::append((char *)&local_590);
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_590,*(ulong *)((long)&joints + lVar9));
        auVar13 = stack0xfffffffffffffad8;
        local_530._0_8_ = &aStack_520;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar12) {
          aStack_520._M_allocated_capacity = paVar12->_M_allocated_capacity;
          peStack_510 = auVar13._24_8_;
          aStack_520._8_8_ = plVar11[3];
        }
        else {
          aStack_520._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_530._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar11;
        }
        local_530._8_8_ = plVar11[1];
        *plVar11 = (long)paVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::_M_assign((string *)(peVar6 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._0_8_ != &aStack_520) {
          operator_delete((void *)local_530._0_8_,aStack_520._M_allocated_capacity + 1);
        }
        if ((double *)local_590.m_data[0] != local_590.m_data + 2) {
          operator_delete((void *)local_590.m_data[0],(long)local_590.m_data[2] + 1);
        }
        peVar6 = local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_3f8 = local_558 + 0x78;
        if (local_558 == (element_type *)0x0) {
          local_3f8 = (element_type *)0x0;
        }
        local_3f0 = a_Stack_550[0]._M_pi;
        if (a_Stack_550[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (a_Stack_550[0]._M_pi)->_M_use_count = (a_Stack_550[0]._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (a_Stack_550[0]._M_pi)->_M_use_count = (a_Stack_550[0]._M_pi)->_M_use_count + 1;
          }
        }
        local_408 = local_568 + 0x78;
        if (local_568 == (ChFrame *)0x0) {
          local_408 = (ChFrame *)0x0;
        }
        local_400 = _Stack_560._M_pi;
        if (_Stack_560._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (_Stack_560._M_pi)->_M_use_count = (_Stack_560._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (_Stack_560._M_pi)->_M_use_count = (_Stack_560._M_pi)->_M_use_count + 1;
          }
        }
        calcJointFrame((ChCoordsys<double> *)local_530,&local_2d8,
                       (ChVector<double> *)(&DAT_00182a18 + lVar9));
        ChFrame<double>::ChFrame(&local_b8,(ChCoordsys<double> *)local_530);
        (**(code **)(*(long *)peVar6 + 0x240))(peVar6,&local_3f8,&local_408,&local_b8);
        if (local_400 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400);
        }
        if (local_3f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0);
        }
        local_418.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(this_02._M_pi + 1);
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
        }
        local_418.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = this_02._M_pi;
        ChLinkMotorRotationAngle::SetAngleFunction
                  ((ChLinkMotorRotationAngle *)
                   local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&local_418);
        if (local_418.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_418.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        plVar11 = *(long **)((local_540->
                             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + 0x38);
        local_3c8 = local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        p_Stack_3c0 = local_5a8.
                      super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        if (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        (**(code **)(*plVar11 + 0x138))(plVar11,&local_3c8);
        if (p_Stack_3c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_3c0);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::pair<std::shared_ptr<chrono::ChLinkMotorRotationAngle>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_530,__x,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)&local_5a8);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLink>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                  (local_4a8,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_530);
        if (local_508._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_508._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._0_8_ != &aStack_520) {
          operator_delete((void *)local_530._0_8_,aStack_520._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
        ::pair<std::shared_ptr<chrono::ChLinkMotorRotationAngle>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_530,__x,(shared_ptr<chrono::ChLinkMotorRotationAngle> *)&local_5a8);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::ChLinkMotorRotation>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::ChLinkMotorRotationAngle>>>
                  (local_498,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotationAngle>_>
                    *)local_530);
        if (local_508._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_508._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._0_8_ != &aStack_520) {
          operator_delete((void *)local_530._0_8_,aStack_520._M_allocated_capacity + 1);
        }
      }
      if (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_5a8.super___shared_ptr<chrono::ChLinkLockLock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
LAB_001424ff:
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
    }
    if (local_598 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_598);
    }
    if (local_4a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a0);
    }
    lVar9 = lVar9 + 0xb0;
    if (lVar9 == 0x6e0) {
      if (_Stack_560._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_560._M_pi);
      }
      if (a_Stack_550[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_550[0]._M_pi);
      }
      return;
    }
  } while( true );
}

Assistant:

void RS_Limb::Initialize(std::shared_ptr<ChBodyAuxRef> chassis,
                         const ChVector<>& xyz,
                         const ChVector<>& rpy,
                         CollisionFamily::Enum collision_family,
                         ActuationMode wheel_mode) {
    // Set absolute position of link0
    auto parent_body = chassis;                               // parent body
    auto child_body = m_links.find("link0")->second->m_body;  // child body
    ChFrame<> X_GP = parent_body->GetFrame_REF_to_abs();      // global -> parent
    ChFrame<> X_PC(xyz, rpy2quat(rpy));                       // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                             // global -> child
    child_body->SetFrame_REF_to_abs(X_GC);

    // Traverse chain (base-to-tip)
    //   set absolute position of the child body
    //   add collision shapes on child body
    //   create joint between parent and child
    for (int i = 0; i < num_joints; i++) {
        auto parent = m_links.find(joints[i].linkA)->second;       // parent part
        auto child = m_links.find(joints[i].linkB)->second;        // child part
        parent_body = parent->m_body;                              // parent body
        child_body = child->m_body;                                // child body
        X_GP = parent_body->GetFrame_REF_to_abs();                 // global -> parent
        X_PC = ChFrame<>(joints[i].xyz, rpy2quat(joints[i].rpy));  // parent -> child
        X_GC = X_GP * X_PC;                                        // global -> child
        child_body->SetFrame_REF_to_abs(X_GC);

        // First joint connects directly to chassis
        if (i == 0)
            parent_body = chassis;

        // Add contact geometry to child body
        child->AddCollisionShapes();

        // Place all links from this limb in the same collision family
        child_body->GetCollisionModel()->SetFamily(collision_family);
        child_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(collision_family);

        // Note: call this AFTER setting the collision family (required for Chrono::Multicore)
        if (child == m_wheel)
            child_body->SetCollide(m_collide_wheel);
        else
            child_body->SetCollide(m_collide_links);

        // Weld joints
        if (joints[i].fixed) {
            auto joint = chrono_types::make_shared<ChLinkLockLock>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, calcJointFrame(X_GC, joints[i].axis));
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            continue;
        }

        // Actuated joints (except the wheel motor joint)
        if (joints[i].name.compare("joint8") != 0) {
            auto motor_fun = chrono_types::make_shared<ChFunction_Setpoint>();
            auto joint = chrono_types::make_shared<ChLinkMotorRotationAngle>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, ChFrame<>(calcJointFrame(X_GC, joints[i].axis)));
            joint->SetAngleFunction(motor_fun);
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            m_motors.insert(std::make_pair(joints[i].name, joint));
            continue;
        }

        // Wheel motor joint
        if (wheel_mode == ActuationMode::SPEED) {
            auto motor_fun = chrono_types::make_shared<ChFunction_Setpoint>();
            auto joint = chrono_types::make_shared<ChLinkMotorRotationSpeed>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, ChFrame<>(calcJointFrame(X_GC, joints[i].axis)));
            joint->SetSpeedFunction(motor_fun);
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            m_motors.insert(std::make_pair(joints[i].name, joint));
            m_wheel_motor = joint;
        } else {
            auto motor_fun = chrono_types::make_shared<ChFunction_Setpoint>();
            auto joint = chrono_types::make_shared<ChLinkMotorRotationAngle>();
            joint->SetNameString(m_name + "_" + joints[i].name);
            joint->Initialize(parent_body, child_body, ChFrame<>(calcJointFrame(X_GC, joints[i].axis)));
            joint->SetAngleFunction(motor_fun);
            chassis->GetSystem()->AddLink(joint);
            m_joints.insert(std::make_pair(joints[i].name, joint));
            m_motors.insert(std::make_pair(joints[i].name, joint));
            m_wheel_motor = joint;
        }
    }
}